

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O3

UBool __thiscall
icu_63::TimeArrayTimeZoneRule::getNextStart
          (TimeArrayTimeZoneRule *this,UDate base,int32_t prevRawOffset,int32_t prevDSTSavings,
          UBool inclusive,UDate *result)

{
  uint uVar1;
  TimeRuleType TVar2;
  UDate *pUVar3;
  bool bVar4;
  ulong uVar5;
  double dVar6;
  
  uVar1 = this->fNumStartTimes;
  uVar5 = (ulong)uVar1;
  if (0 < (long)(int)uVar1) {
    pUVar3 = this->fStartTimes;
    TVar2 = this->fTimeRuleType;
    uVar5 = (long)(int)uVar1;
    do {
      dVar6 = pUVar3[uVar5 - 1];
      if (TVar2 != UTC_TIME) {
        dVar6 = dVar6 - (double)prevRawOffset;
      }
      if (TVar2 == WALL_TIME) {
        dVar6 = dVar6 - (double)prevDSTSavings;
      }
      if ((dVar6 < base) || (inclusive == '\0' && dVar6 == base)) goto LAB_002008c6;
      *result = dVar6;
      bVar4 = 1 < uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar4);
    uVar5 = 0;
  }
LAB_002008c6:
  return (uint)uVar5 != uVar1;
}

Assistant:

UBool
TimeArrayTimeZoneRule::getNextStart(UDate base,
                                    int32_t prevRawOffset,
                                    int32_t prevDSTSavings,
                                    UBool inclusive,
                                    UDate& result) const {
    int32_t i = fNumStartTimes - 1;
    for (; i >= 0; i--) {
        UDate time = getUTC(fStartTimes[i], prevRawOffset, prevDSTSavings);
        if (time < base || (!inclusive && time == base)) {
            break;
        }
        result = time;
    }
    if (i == fNumStartTimes - 1) {
        return FALSE;
    }
    return TRUE;
}